

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O0

ssize_t __thiscall zmq::mailbox_t::recv(mailbox_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  __pid_t _Var1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  void *__buf_00;
  bool bVar7;
  bool ok;
  char *errstr_1;
  char *errstr;
  int rc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar8;
  
  if ((this->_active & 1U) != 0) {
    uVar3 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf,__n);
    if ((uVar3 & 1) != 0) {
      uVar8 = 0;
      goto LAB_002b5a46;
    }
    this->_active = false;
  }
  _Var1 = signaler_t::wait(&this->_signaler,(void *)((ulong)__buf & 0xffffffff));
  if (_Var1 == -1) {
    piVar4 = __errno_location();
    bVar7 = true;
    if (*piVar4 != 0xb) {
      piVar4 = __errno_location();
      bVar7 = *piVar4 == 4;
    }
    if (!bVar7) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox.cpp"
              ,0x53);
      fflush(_stderr);
      zmq_abort((char *)0x2b592c);
    }
    uVar8 = 0xffffffff;
  }
  else {
    iVar2 = signaler_t::recv_failable
                      ((signaler_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0xb) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox.cpp"
                ,0x5a);
        fflush(_stderr);
        zmq_abort((char *)0x2b59bd);
      }
      uVar8 = 0xffffffff;
    }
    else {
      this->_active = true;
      sVar6 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf_00,__n);
      if ((((byte)sVar6 & 1 ^ 0xff) & 1) != 0) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ok",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox.cpp"
                ,99);
        fflush(_stderr);
        zmq_abort((char *)0x2b5a3c);
      }
      uVar8 = 0;
    }
  }
LAB_002b5a46:
  return (ulong)uVar8;
}

Assistant:

int zmq::mailbox_t::recv (command_t *cmd_, int timeout_)
{
    //  Try to get the command straight away.
    if (_active) {
        if (_cpipe.read (cmd_))
            return 0;

        //  If there are no more commands available, switch into passive state.
        _active = false;
    }

    //  Wait for signal from the command sender.
    int rc = _signaler.wait (timeout_);
    if (rc == -1) {
        errno_assert (errno == EAGAIN || errno == EINTR);
        return -1;
    }

    //  Receive the signal.
    rc = _signaler.recv_failable ();
    if (rc == -1) {
        errno_assert (errno == EAGAIN);
        return -1;
    }

    //  Switch into active state.
    _active = true;

    //  Get a command.
    const bool ok = _cpipe.read (cmd_);
    zmq_assert (ok);
    return 0;
}